

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_streams_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint uVar1;
  int iVar2;
  long in_RSI;
  st_quicly_conn_t *in_RDI;
  quicly_maxsender_t *maxsender;
  quicly_conn_t *_conn;
  int ret;
  int uni;
  quicly_streams_blocked_frame_t frame;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint8_t *in_stack_ffffffffffffffc0;
  quicly_maxsender_t *m;
  uint8_t **in_stack_ffffffffffffffc8;
  st_quicly_conn_t *arg0;
  st_quicly_conn_t *in_stack_ffffffffffffffe0;
  int local_4;
  
  uVar1 = (uint)(*(long *)(in_RSI + 0x18) == 0x17);
  local_4 = quicly_decode_streams_blocked_frame
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (quicly_streams_blocked_frame_t *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    arg0 = in_RDI;
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar2 = ptls_skip_tracing((in_RDI->crypto).tls), iVar2 == 0)) {
      QUICLY_STREAMS_BLOCKED_RECEIVE
                (in_stack_ffffffffffffffe0,CONCAT44(uVar1,local_4),(uint64_t)arg0,
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
    QUICLY_TRACER_STREAMS_BLOCKED_RECEIVE
              (arg0,(int64_t)in_stack_ffffffffffffffc8,(uint64_t)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
    iVar2 = should_send_max_streams
                      ((quicly_conn_t *)CONCAT44(uVar1,local_4),(int)((ulong)arg0 >> 0x20));
    if (iVar2 != 0) {
      if (uVar1 == 0) {
        m = &(in_RDI->ingress).max_streams.bidi;
      }
      else {
        m = &(in_RDI->ingress).max_streams.uni;
      }
      quicly_maxsender_request_transmit(m);
      (in_RDI->egress).send_ack_at = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int handle_streams_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_streams_blocked_frame_t frame;
    int uni = state->frame_type == QUICLY_FRAME_TYPE_STREAMS_BLOCKED_UNI, ret;

    if ((ret = quicly_decode_streams_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(STREAMS_BLOCKED_RECEIVE, conn, conn->stash.now, frame.count, uni);

    if (should_send_max_streams(conn, uni)) {
        quicly_maxsender_t *maxsender = uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
        quicly_maxsender_request_transmit(maxsender);
        conn->egress.send_ack_at = 0;
    }

    return 0;
}